

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::writer::operator()
          (writer *this,
          flat_map<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>,_std::less<boost::basic_string_ref<char,_std::char_traits<char>_>_>,_void>
          *vals)

{
  pointer bg;
  reference val;
  pointer ppVar1;
  const_iterator __begin0;
  unsigned_short local_2a;
  vec_iterator<std::pair<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>_>_*,_true>
  local_28;
  
  local_2a = (unsigned_short)(vals->m_flat_tree).m_data.m_seq.m_holder.m_size;
  operator()(this,&local_2a);
  local_28.m_ptr =
       (pair<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>_>
        *)(vals->m_flat_tree).m_data.m_seq.m_holder.m_start;
  ppVar1 = (pointer)local_28.m_ptr + (vals->m_flat_tree).m_data.m_seq.m_holder.m_size;
  while (local_28.m_ptr !=
         (pair<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>_>
          *)ppVar1) {
    val = boost::container::
          vec_iterator<std::pair<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>_>_*,_true>
          ::operator*(&local_28);
    operator()(this,&val->first);
    operator()(this,&val->second);
    boost::container::
    vec_iterator<std::pair<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>_>_*,_true>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void operator()(boost::container::flat_map<K,V> const& vals) const {
        (*this)(static_cast<uint16_t>(vals.size()));
        for (auto&& val : vals) {
            (*this)(val.first);
            (*this)(val.second);
        }
    }